

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O2

string * __thiscall
t_d_generator::render_req_abi_cxx11_(string *__return_storage_ptr__,t_d_generator *this,e_req req)

{
  ostream *this_00;
  undefined8 uVar1;
  char *pcVar2;
  stringstream ss;
  ostream local_190;
  
  if (req == T_REQUIRED) {
    pcVar2 = "TReq.REQUIRED";
  }
  else if (req == T_OPTIONAL) {
    pcVar2 = "TReq.OPTIONAL";
  }
  else {
    if (req != T_OPT_IN_REQ_OUT) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      this_00 = std::operator<<(&local_190,"Compiler error: Invalid requirement level ");
      std::ostream::operator<<(this_00,req);
      uVar1 = __cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      __cxa_throw(uVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    pcVar2 = "TReq.OPT_IN_REQ_OUT";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string render_req(t_field::e_req req) const {
    switch (req) {
    case t_field::T_OPT_IN_REQ_OUT:
      return "TReq.OPT_IN_REQ_OUT";
    case t_field::T_OPTIONAL:
      return "TReq.OPTIONAL";
    case t_field::T_REQUIRED:
      return "TReq.REQUIRED";
    default: {
      std::stringstream ss;
      ss << "Compiler error: Invalid requirement level " << req;
      throw ss.str();
    }
    }
  }